

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_double<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,longdouble value,format_specs *spec)

{
  undefined1 uVar1;
  undefined2 uVar2;
  core_format_specs spec_00;
  bool bVar3;
  alignment aVar4;
  type pwVar5;
  char *local_318;
  char *local_310;
  undefined1 local_301;
  double_writer local_2f0;
  type local_2d8;
  type *local_2d0;
  type *it;
  undefined4 uStack_2c0;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  bool use_grisu;
  allocator<char> local_271;
  undefined1 local_270 [8];
  memory_buffer buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler handler;
  format_specs *spec_local;
  longdouble value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_local;
  
  _spec_local = value;
  float_spec_handler::float_spec_handler
            ((float_spec_handler *)&write_inf_or_nan.field_0x1e,(spec->super_core_format_specs).type
            );
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>
            (write_inf_or_nan._30_1_,(float_spec_handler *)&write_inf_or_nan.field_0x1e);
  write_inf_or_nan._29_1_ = 0;
  bVar3 = std::signbit(value);
  if (bVar3) {
    write_inf_or_nan._29_1_ = 0x2d;
    _spec_local = -value;
  }
  else {
    bVar3 = core_format_specs::has(&spec->super_core_format_specs,1);
    if (bVar3) {
      bVar3 = core_format_specs::has(&spec->super_core_format_specs,2);
      local_301 = 0x2b;
      if (!bVar3) {
        local_301 = 0x20;
      }
      write_inf_or_nan._29_1_ = local_301;
    }
  }
  write_inf_or_nan.spec.super_align_spec.align_._0_1_ = (spec->super_core_format_specs).flags;
  write_inf_or_nan.spec.super_align_spec.align_._1_1_ = (spec->super_core_format_specs).type;
  write_inf_or_nan.writer =
       *(basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> **)
        &spec->super_align_spec;
  write_inf_or_nan.spec.super_align_spec._0_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  write_inf_or_nan.spec.super_core_format_specs.precision._0_1_ = write_inf_or_nan._29_1_;
  buffer._528_8_ = this;
  bVar3 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<long_double>(_spec_local);
  if (bVar3) {
    if ((write_inf_or_nan._31_1_ & 1) == 0) {
      local_310 = "nan";
    }
    else {
      local_310 = "NAN";
    }
    write_double<long_double>::write_inf_or_nan_t::operator()
              ((write_inf_or_nan_t *)(buffer.store_ + 0x1f0),local_310);
  }
  else {
    bVar3 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>(_spec_local);
    if (bVar3) {
      if ((write_inf_or_nan._31_1_ & 1) == 0) {
        local_318 = "inf";
      }
      else {
        local_318 = "INF";
      }
      write_double<long_double>::write_inf_or_nan_t::operator()
                ((write_inf_or_nan_t *)(buffer.store_ + 0x1f0),local_318);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_270,&local_271);
      std::allocator<char>::~allocator(&local_271);
      uVar1 = (spec->super_core_format_specs).flags;
      uVar2 = *(undefined2 *)&(spec->super_core_format_specs).field_0x6;
      normalized_spec.super_align_spec.fill_ =
           (wchar_t)((ulong)*(undefined8 *)&(spec->super_align_spec).align_ >> 0x20);
      spec_00.flags = uVar1;
      spec_00.precision = normalized_spec.super_align_spec.fill_;
      spec_00.type = write_inf_or_nan._30_1_;
      spec_00._6_2_ = uVar2;
      internal::sprintf_format<long_double>(_spec_local,(buffer *)local_270,spec_00);
      as._4_8_ = internal::basic_buffer<char>::size((basic_buffer<char> *)local_270);
      it._4_4_ = (spec->super_align_spec).width_;
      uStack_2c0 = (spec->super_align_spec).fill_;
      as.width_ = (spec->super_align_spec).align_;
      aVar4 = align_spec::align(&spec->super_align_spec);
      if (aVar4 == ALIGN_NUMERIC) {
        if (write_inf_or_nan._29_1_ != '\0') {
          pwVar5 = reserve(this,1);
          local_2d0 = &local_2d8;
          local_2d8 = pwVar5 + 1;
          *pwVar5 = (int)(char)write_inf_or_nan._29_1_;
          write_inf_or_nan._29_1_ = 0;
          if (it._4_4_ != 0) {
            stack0xfffffffffffffd3c = CONCAT44(uStack_2c0,it._4_4_ + -1);
          }
        }
        as.width_ = 2;
      }
      else {
        aVar4 = align_spec::align(&spec->super_align_spec);
        if (aVar4 == ALIGN_DEFAULT) {
          as.width_ = 2;
        }
        if (write_inf_or_nan._29_1_ != '\0') {
          as._4_8_ = as._4_8_ + 1;
        }
      }
      local_2f0.n._0_4_ = as.fill_;
      local_2f0.n._4_4_ = as.align_;
      local_2f0.sign = write_inf_or_nan._29_1_;
      local_2f0.buffer = (buffer *)local_270;
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
      write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::double_writer>
                ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>
                  *)this,(align_spec *)((long)&it + 4),&local_2f0);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_270);
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}